

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
 __thiscall ninx::parser::Parser::parse_function_argument(Parser *this)

{
  int iVar1;
  Token *token;
  Variable *this_00;
  string *psVar2;
  FunctionArgument *this_01;
  ParserException *this_02;
  string *in_RSI;
  _Alloc_hider local_50;
  
  psVar2 = in_RSI + 1;
  token = TokenReader::get_token((TokenReader *)psVar2);
  iVar1 = (*token->_vptr_Token[2])(token);
  if (iVar1 == 3) {
    iVar1 = TokenReader::check_limiter((TokenReader *)psVar2,'=');
    if (iVar1 == 0) {
      local_50._M_p = (pointer)0x0;
    }
    else {
      TokenReader::get_token((TokenReader *)psVar2);
      parse_level_3_expression((Parser *)&stack0xffffffffffffffb0);
    }
    this_00 = (Variable *)
              __dynamic_cast(token,&lexer::token::Token::typeinfo,&lexer::token::Variable::typeinfo,
                             0);
    psVar2 = lexer::token::Variable::get_name_abi_cxx11_(this_00);
    this_01 = (FunctionArgument *)operator_new(0x40);
    element::FunctionArgument::FunctionArgument
              (this_01,psVar2,
               (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)&stack0xffffffffffffffb0);
    (this->origin)._M_dataplus._M_p = (pointer)this_01;
    if ((long *)local_50._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_p + 8))();
    }
    return (__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>,_true,_true>
              )this;
  }
  this_02 = (ParserException *)__cxa_allocate_exception(0x20);
  local_50._M_p = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb0,
             "Argument expected but not found. Maybe you forgot to prepend $ to the argument name?",
             "");
  exception::ParserException::ParserException
            (this_02,token,in_RSI,(string *)&stack0xffffffffffffffb0);
  __cxa_throw(this_02,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<FunctionArgument> ninx::parser::Parser::parse_function_argument() {
    auto raw_token{reader.get_token()};

    if (raw_token->get_type() != Type::VARIABLE) {
        throw ParserException(raw_token, this->origin, "Argument expected but not found. Maybe "
                                                       "you forgot to prepend $ to the argument"
                                                       " name?");
    }

    std::unique_ptr<Expression> default_value{nullptr};

    // Check if the argument does have a default value
    if (reader.check_limiter('=')) {
        reader.get_token();

        default_value = parse_expression();
    }

    auto argument_token{dynamic_cast<ninx::lexer::token::Variable *>(raw_token)};

    auto argument = std::make_unique<FunctionArgument>(argument_token->get_name(), std::move(default_value));

    return argument;
}